

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::BlobProto::BlobProto(BlobProto *this)

{
  BlobProto *pBVar1;
  BlobProto *this_local;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__BlobProto_00d4d8a0
  ;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  memset(&this->_has_bits_,0,4);
  google::protobuf::RepeatedField<float>::RepeatedField(&this->data_);
  google::protobuf::RepeatedField<float>::RepeatedField(&this->diff_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->double_data_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->double_diff_);
  pBVar1 = internal_default_instance();
  if (this != pBVar1) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

BlobProto::BlobProto()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.BlobProto)
}